

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O2

int CVmObjString::find_common<_1>(vm_val_t *retval,vm_val_t *self_val,char *str,uint *argc)

{
  vm_val_t *this;
  uint uVar1;
  vm_val_t *pvVar2;
  int iVar3;
  int32_t iVar4;
  char *pcVar5;
  size_t sVar6;
  int iVar7;
  CVmObjPageEntry *pat;
  uint uVar8;
  utf8_ptr str_00;
  ulong bytecnt;
  ulong len_00;
  char *p;
  size_t len;
  int match_idx;
  utf8_ptr strp;
  int match_len;
  
  if (argc == (uint *)0x0) {
    uVar8 = 0;
  }
  else {
    uVar8 = *argc;
  }
  if ((find_common<-1>(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc == '\0') &&
     (iVar3 = __cxa_guard_acquire(&find_common<-1>(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)
                                   ::desc), iVar3 != 0)) {
    find_common<-1>::desc.min_argc_ = 1;
    find_common<-1>::desc.opt_argc_ = 1;
    find_common<-1>::desc.varargs_ = 0;
    __cxa_guard_release(&find_common<-1>(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc)
    ;
  }
  iVar3 = CVmObject::get_prop_check_argc(retval,argc,&find_common<-1>::desc);
  pvVar2 = sp_;
  if (iVar3 != 0) {
    return 1;
  }
  bytecnt = (ulong)*(ushort *)str;
  this = sp_ + -1;
  len = bytecnt;
  pcVar5 = vm_val_t::get_as_string(this);
  if (pcVar5 == (char *)0x0) {
    if ((this->typ != VM_OBJ) ||
       (iVar3 = CVmObjPattern::is_pattern_obj(pvVar2[-1].val.obj), iVar3 == 0)) {
      err_throw(0x900);
    }
    uVar1 = pvVar2[-1].val.obj;
    pat = G_obj_table_X.pages_[uVar1 >> 0xc] + (uVar1 & 0xfff);
  }
  else {
    pat = (CVmObjPageEntry *)0x0;
  }
  p = str + 2;
  if ((uVar8 < 2) || (sp_[-2].typ == VM_NIL)) {
    sVar6 = utf8_ptr::s_len(p,bytecnt);
    iVar3 = (int)sVar6;
    len = 0;
    len_00 = 0;
    str_00.p_ = p + bytecnt;
  }
  else {
    iVar4 = vm_val_t::num_to_int(sp_ + -2);
    strp.p_ = p;
    if (iVar4 < 1) {
      sVar6 = utf8_ptr::s_len(p,bytecnt);
      iVar3 = (int)sVar6;
    }
    else {
      iVar3 = -1;
    }
    iVar3 = iVar3 + iVar4;
    iVar7 = 0;
    len_00 = bytecnt;
    while ((iVar7 < iVar3 && (len_00 != 0))) {
      iVar7 = iVar7 + 1;
      utf8_ptr::inc(&strp,&len);
      len_00 = len;
    }
    str_00.p_ = strp.p_;
    if (iVar7 < iVar3) {
      retval->typ = VM_NIL;
      goto LAB_002a861a;
    }
  }
  pcVar5 = find_last_substr(self_val,p,str_00.p_,len_00,pcVar5,(CVmObjPattern *)pat,&match_idx,
                            &match_len);
  if (pcVar5 == (char *)0x0) {
    retval->typ = VM_NIL;
  }
  else {
    retval->typ = VM_INT;
    (retval->val).obj = match_idx + iVar3 + 1;
  }
LAB_002a861a:
  sp_ = sp_ + -(long)(int)uVar8;
  return 1;
}

Assistant:

inline int CVmObjString::find_common(
    VMG_ vm_val_t *retval,
    const vm_val_t *self_val, const char *str,
    uint *argc)
{
    /* check arguments */
    uint orig_argc = (argc != 0 ? *argc : 0);
    static CVmNativeCodeDesc desc(1, 1);
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* get the string length and buffer pointer */
    size_t len = vmb_get_len(str);
    str += VMB_LEN;

    /* remember where the base string strings */
    const char *basestr = str;

    /* retrieve the string or regex pattern to find */
    vm_val_t *val2 = G_stk->get(0);
    const char *str2 = val2->get_as_string(vmg0_);
    CVmObjPattern *pat2 = 0;
    if (str2 != 0)
    {
        /* we have a simple string to find */
    }
    else if (val2->typ == VM_OBJ
             && CVmObjPattern::is_pattern_obj(vmg_ val2->val.obj))
    {
        /* it's a pattern */
        pat2 = (CVmObjPattern *)vm_objp(vmg_ val2->val.obj);
    }
    else
    {
        /* we need a string or a pattern; other values are invalid */
        err_throw(VMERR_BAD_TYPE_BIF);
    }

    /* if there's a starting index, skip that many characters */
    int32_t start_idx = 0;
    if (orig_argc >= 2 && G_stk->get(1)->typ != VM_NIL)
    {
        /* get the starting index value */
        start_idx = G_stk->get(1)->num_to_int(vmg0_);

        /* set up a UTF-8 pointer for traversing the string */
        utf8_ptr strp((char *)str);

        /*
         *   A positive index value is a 1-based index from the start of the
         *   string.  A negative index is from the end of the string, with -1
         *   pointing to the last character.  For reverse searches, 0 is the
         *   position past the last character.  In any case, adjust to a
         *   zero-based index.
         */
        start_idx += (start_idx == 0 && dir < 0 ? (int)strp.len(len) :
                      start_idx < 0 ? (int)strp.len(len) :
                      -1);

        /* if there's a substring, we can limit the skip */
        size_t min_len = (dir > 0 && str2 != 0 ? vmb_get_len(str2) : 0);

        /* skip that many characters */
        int32_t i;
        for (i = 0 ; i < start_idx && len > min_len ; ++i, strp.inc(&len)) ;

        /* 
         *   if the start index was past the end of the string (or past the
         *   point where the remaining subject string is too short for the
         *   target string), we definitely can't match 
         */
        if (i < start_idx)
        {
            retval->set_nil();
            goto done;
        }

        /* start the search here */
        str = strp.getptr();
    }
    else if (dir < 0)
    {
        /* 
         *   we're searching backwards, and there's no starting index, so the
         *   starting point is the end of the string 
         */
        str = str + len;
        start_idx = utf8_ptr::s_len(basestr, len);
        len = 0;
    }

    /* find the substring */
    int match_idx, match_len;
    if (dir > 0
        ? find_substr(vmg_ self_val, basestr, str, len, str2, pat2,
                      &match_idx, &match_len) != 0
        : find_last_substr(vmg_ self_val, basestr, str, len, str2, pat2,
                           &match_idx, &match_len) != 0)
    {
        /* found it - adjust to a 1-based value for return */
        retval->set_int(start_idx + match_idx + 1);
    }
    else
    {
        /* didn't find it - return nil */
        retval->set_nil();
    }

done:
    /* discard arguments */
    G_stk->discard(orig_argc);

    /* handled */
    return TRUE;
}